

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O0

void vkt::texture::util::wrapTexelGridCoordLinear
               (IVec3 *baseTexel,IVec3 *texelGridOffset,int coordBits,ImgDim dim)

{
  int iVar1;
  int *piVar2;
  int local_2c;
  int local_28;
  int compNdx;
  int numComp;
  int subdivisions;
  ImgDim dim_local;
  int coordBits_local;
  IVec3 *texelGridOffset_local;
  IVec3 *baseTexel_local;
  
  subdivisions._0_1_ = (byte)coordBits;
  iVar1 = 1 << ((byte)subdivisions & 0x1f);
  switch(dim) {
  case IMG_DIM_1D:
    local_28 = 1;
    break;
  case IMG_DIM_2D:
    local_28 = 2;
    break;
  case IMG_DIM_3D:
    local_28 = 3;
    break;
  case IMG_DIM_CUBE:
    local_28 = 2;
    break;
  default:
    local_28 = 0;
  }
  for (local_2c = 0; local_2c < local_28; local_2c = local_2c + 1) {
    piVar2 = tcu::Vector<int,_3>::operator[](texelGridOffset,local_2c);
    *piVar2 = *piVar2 - iVar1 / 2;
    piVar2 = tcu::Vector<int,_3>::operator[](texelGridOffset,local_2c);
    if (*piVar2 < 0) {
      piVar2 = tcu::Vector<int,_3>::operator[](baseTexel,local_2c);
      *piVar2 = *piVar2 + -1;
      piVar2 = tcu::Vector<int,_3>::operator[](texelGridOffset,local_2c);
      *piVar2 = iVar1 + *piVar2;
    }
  }
  return;
}

Assistant:

void wrapTexelGridCoordLinear (IVec3&		baseTexel,
							   IVec3&		texelGridOffset,
							   const int	coordBits,
							   const ImgDim dim)
{
	const int subdivisions = 1 << coordBits;

	int numComp;

	switch (dim)
	{
		case IMG_DIM_1D:
			numComp = 1;
			break;

		case IMG_DIM_2D:
			numComp = 2;
			break;

		case IMG_DIM_CUBE:
			numComp = 2;
			break;

		case IMG_DIM_3D:
			numComp = 3;
			break;

		default:
			numComp = 0;
			break;
	}

	for (int compNdx = 0; compNdx < numComp; ++compNdx)
	{
		texelGridOffset[compNdx] -= subdivisions / (int) 2;

		if (texelGridOffset[compNdx] < 0)
		{
			baseTexel      [compNdx] -= 1;
			texelGridOffset[compNdx] += (deInt32) subdivisions;
		}
	}
}